

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O2

void __thiscall FileTree::FileTree(FileTree *this)

{
  TreeNode *this_00;
  allocator local_31;
  string local_30;
  
  this->root = (TreeNode *)0x0;
  this_00 = (TreeNode *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_30,"/",&local_31);
  TreeNode::TreeNode(this_00,&local_30,false);
  this->root = this_00;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

FileTree()
    {
        root = new TreeNode("/", false);
    }